

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

QLayoutItem * __thiscall QtMWidgets::ToolBarLayout::takeAt(ToolBarLayout *this,int index)

{
  long lVar1;
  QLayoutItem *pQVar2;
  
  if (-1 < index) {
    lVar1 = (this->buttons).d.size;
    if ((long)(ulong)(uint)index < lVar1 + 2) {
      if (index == 0) {
        pQVar2 = (QLayoutItem *)this->left;
        this->left = (QWidgetItem *)0x0;
        return pQVar2;
      }
      if (lVar1 + 1U == (ulong)(uint)index) {
        pQVar2 = (QLayoutItem *)this->right;
        this->right = (QWidgetItem *)0x0;
        return pQVar2;
      }
      pQVar2 = QList<QLayoutItem_*>::takeAt(&this->buttons,(ulong)(index - 1));
      return pQVar2;
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *
ToolBarLayout::takeAt( int index )
{
	if( index >= 0 && index < buttons.size() + 2 )
	{
		if( index == 0 )
		{
			QLayoutItem * item = left;
			left = 0;
			return item;
		}
		else if( index == buttons.size() + 1 )
		{
			QLayoutItem * item = right;
			right = 0;
			return item;
		}
		else
		{
			QLayoutItem * item = buttons.takeAt( index - 1 );
			return item;
		}
	}
	else
		return 0;
}